

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGhsMultiGenerator.cxx
# Opt level: O1

void __thiscall
cmLocalGhsMultiGenerator::ComputeObjectFilenames
          (cmLocalGhsMultiGenerator *this,
          map<const_cmSourceFile_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *mapping,cmGeneratorTarget *gt)

{
  int iVar1;
  cmSourceFile *pcVar2;
  string *psVar3;
  mapped_type_conflict1 *pmVar4;
  _Rb_tree_node_base *p_Var5;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  bool keptSourceExtension;
  string objectNameLower;
  string dir_max;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  counts;
  string local_198;
  cmSourceFile *local_178;
  _Rb_tree_node_base *local_170;
  string local_168;
  string local_148;
  string local_128;
  cmGeneratorTarget *local_f0;
  string local_e8;
  _Base_ptr local_c8;
  string *local_c0;
  pointer local_b8;
  pointer local_b0;
  undefined1 *local_a8;
  undefined8 local_a0;
  undefined1 *local_98;
  undefined8 local_90;
  string local_88;
  undefined1 local_68 [32];
  _Base_ptr local_48;
  size_t local_40;
  
  psVar3 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(&this->super_cmLocalGenerator);
  local_f0 = gt;
  (*(this->super_cmLocalGenerator).super_cmOutputConverter._vptr_cmOutputConverter[0x10])
            (&local_198,this,gt);
  local_e8._M_string_length = (size_type)(psVar3->_M_dataplus)._M_p;
  local_e8._M_dataplus._M_p = (pointer)psVar3->_M_string_length;
  local_e8.field_2._M_allocated_capacity = 0;
  local_c8 = (_Base_ptr)(local_68 + 0x18);
  local_68._0_8_ = 0;
  local_68._8_8_ = 1;
  local_68[0x18] = 0x2f;
  local_e8.field_2._8_8_ = 1;
  local_c0 = (string *)0x0;
  local_b8 = (pointer)local_198._M_string_length;
  local_b0 = local_198._M_dataplus._M_p;
  local_128.field_2._M_allocated_capacity = (long)&local_128.field_2 + 8;
  local_128._M_dataplus._M_p = (pointer)0x0;
  local_128._M_string_length = 1;
  local_128.field_2._M_local_buf[8] = '/';
  local_a0 = 1;
  local_90 = 0;
  views._M_len = 4;
  views._M_array = (iterator)&local_e8;
  local_a8 = (undefined1 *)&local_198;
  local_98 = (undefined1 *)local_128.field_2._M_allocated_capacity;
  local_68._16_8_ = local_c8;
  cmCatViews(&local_88,views);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  local_68._24_8_ = local_68 + 8;
  local_68._8_8_ = local_68._8_8_ & 0xffffffff00000000;
  local_68._16_8_ = (_Base_ptr)0x0;
  local_40 = 0;
  p_Var5 = (mapping->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_170 = &(mapping->_M_t)._M_impl.super__Rb_tree_header._M_header;
  local_178 = (cmSourceFile *)mapping;
  local_48 = (_Base_ptr)local_68._24_8_;
  if (p_Var5 != local_170) {
    do {
      pcVar2 = *(cmSourceFile **)(p_Var5 + 1);
      psVar3 = cmSourceFile::GetFullPath_abi_cxx11_(pcVar2);
      cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_168,psVar3);
      cmsys::SystemTools::LowerCase(&local_198,&local_168);
      cmGlobalGenerator::GetLanguageOutputExtension_abi_cxx11_
                (&local_148,(this->super_cmLocalGenerator).GlobalGenerator,pcVar2);
      local_e8._M_dataplus._M_p = (pointer)local_198._M_string_length;
      local_e8._M_string_length = (size_type)local_198._M_dataplus._M_p;
      local_e8.field_2._8_8_ = local_148._M_string_length;
      local_c8 = (_Base_ptr)local_148._M_dataplus._M_p;
      views_00._M_len = 2;
      views_00._M_array = (iterator)&local_e8;
      local_e8.field_2._M_allocated_capacity = (size_type)&local_198;
      local_c0 = &local_148;
      cmCatViews(&local_128,views_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != &local_198.field_2) {
        operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2) {
        operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
      }
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                             *)local_68,&local_128);
      *pmVar4 = *pmVar4 + 1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p,
                        (ulong)(local_128.field_2._M_allocated_capacity + 1));
      }
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
    } while (p_Var5 != local_170);
  }
  p_Var5 = (_Rb_tree_node_base *)(local_178->Location).Directory._M_string_length;
  if (p_Var5 != local_170) {
    do {
      local_178 = *(cmSourceFile **)(p_Var5 + 1);
      psVar3 = cmSourceFile::GetFullPath_abi_cxx11_(local_178);
      cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_198,psVar3);
      cmGlobalGenerator::GetLanguageOutputExtension_abi_cxx11_
                (&local_168,(this->super_cmLocalGenerator).GlobalGenerator,local_178);
      local_e8._M_dataplus._M_p = (pointer)local_198._M_string_length;
      local_e8._M_string_length = (size_type)local_198._M_dataplus._M_p;
      local_e8.field_2._8_8_ = local_168._M_string_length;
      local_c8 = (_Base_ptr)local_168._M_dataplus._M_p;
      views_01._M_len = 2;
      views_01._M_array = (iterator)&local_e8;
      local_e8.field_2._M_allocated_capacity = (size_type)&local_198;
      local_c0 = &local_168;
      cmCatViews(&local_128,views_01);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2) {
        operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != &local_198.field_2) {
        operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
      }
      cmsys::SystemTools::LowerCase(&local_e8,&local_128);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                             *)local_68,&local_e8);
      iVar1 = *pmVar4;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,
                        (ulong)(local_e8.field_2._M_allocated_capacity + 1));
      }
      pcVar2 = local_178;
      if (1 < iVar1) {
        cmGeneratorTarget::AddExplicitObjectName(local_f0,local_178);
        cmLocalGenerator::GetObjectFileNameWithoutTarget
                  (&local_e8,&this->super_cmLocalGenerator,pcVar2,&local_88,(bool *)&local_198,
                   (char *)0x0);
        std::__cxx11::string::operator=((string *)&local_128,(string *)&local_e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,
                          (ulong)(local_e8.field_2._M_allocated_capacity + 1));
        }
        cmsys::SystemTools::ReplaceString(&local_128,"/","_");
      }
      std::__cxx11::string::_M_assign((string *)&p_Var5[1]._M_parent);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p,
                        (ulong)(local_128.field_2._M_allocated_capacity + 1));
      }
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
    } while (p_Var5 != local_170);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmLocalGhsMultiGenerator::ComputeObjectFilenames(
  std::map<cmSourceFile const*, std::string>& mapping,
  cmGeneratorTarget const* gt)
{
  std::string dir_max = cmStrCat(this->GetCurrentBinaryDirectory(), '/',
                                 this->GetTargetDirectory(gt), '/');

  // Count the number of object files with each name.  Note that
  // filesystem may not be case sensitive.
  std::map<std::string, int> counts;

  for (auto const& si : mapping) {
    cmSourceFile const* sf = si.first;
    std::string objectNameLower = cmStrCat(
      cmSystemTools::LowerCase(
        cmSystemTools::GetFilenameWithoutLastExtension(sf->GetFullPath())),
      this->GlobalGenerator->GetLanguageOutputExtension(*sf));
    counts[objectNameLower] += 1;
  }

  // For all source files producing duplicate names we need unique
  // object name computation.
  for (auto& si : mapping) {
    cmSourceFile const* sf = si.first;
    std::string objectName = cmStrCat(
      cmSystemTools::GetFilenameWithoutLastExtension(sf->GetFullPath()),
      this->GlobalGenerator->GetLanguageOutputExtension(*sf));

    if (counts[cmSystemTools::LowerCase(objectName)] > 1) {
      const_cast<cmGeneratorTarget*>(gt)->AddExplicitObjectName(sf);
      bool keptSourceExtension;
      objectName = this->GetObjectFileNameWithoutTarget(*sf, dir_max,
                                                        &keptSourceExtension);
      cmsys::SystemTools::ReplaceString(objectName, "/", "_");
    }
    si.second = objectName;
  }
}